

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateVkImpl.cpp
# Opt level: O1

void __thiscall Diligent::PipelineStateVkImpl::DvpValidateResourceLimits(PipelineStateVkImpl *this)

{
  PipelineStateDesc *pPVar1;
  uint32_t *Args_6;
  uint32_t *Args_6_00;
  uint32_t *Args_6_01;
  int *piVar2;
  VkBool32 VVar3;
  VulkanPhysicalDevice *pVVar4;
  VulkanPhysicalDevice *pVVar5;
  PipelineResourceSignatureVkImpl *this_00;
  uint uVar6;
  Int32 IVar7;
  SHADER_TYPE SVar8;
  RenderDeviceVkImpl *pRVar9;
  PipelineResourceDesc *Args_4;
  PipelineResourceAttribsType *pPVar10;
  ulong uVar11;
  uint32_t *Args_6_02;
  ulong uVar12;
  Uint32 ResIndex;
  Uint32 ShaderInd;
  SHADER_TYPE ShaderType;
  long lVar13;
  uint32_t *Args_6_03;
  array<unsigned_int,_16UL> *paVar14;
  bool bVar15;
  bool bVar16;
  string msg;
  Uint32 NumSampledImages;
  undefined4 uStack_26c;
  Uint32 NumInputAttachments;
  Uint32 NumDynamicUniformBuffers;
  Uint32 NumUniformBuffers;
  Uint32 NumDynamicStorageBuffers;
  Uint32 NumStorageBuffers;
  Uint32 NumStorageImages;
  VulkanPhysicalDevice *local_250;
  VulkanPhysicalDevice *local_248;
  Uint32 NumAccelerationStructures;
  Uint32 NumSamplers;
  PipelineResourceSignatureDesc *local_238;
  array<bool,_6UL> ShaderStagePresented;
  array<unsigned_int,_16UL> DescriptorCount;
  array<std::array<unsigned_int,_16UL>,_6UL> PerStageDescriptorCount;
  
  pRVar9 = DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
           ::GetDevice((DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                        *)this);
  pVVar4 = (pRVar9->m_PhysicalDevice)._M_t.
           super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           ._M_t.
           super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl;
  pRVar9 = DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
           ::GetDevice((DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                        *)this);
  pVVar5 = (pRVar9->m_PhysicalDevice)._M_t.
           super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           ._M_t.
           super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl;
  pRVar9 = DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
           ::GetDevice((DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                        *)this);
  local_248 = (pRVar9->m_PhysicalDevice)._M_t.
              super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
              ._M_t.
              super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
              .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl;
  pRVar9 = DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
           ::GetDevice((DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                        *)this);
  local_250 = (pRVar9->m_PhysicalDevice)._M_t.
              super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
              ._M_t.
              super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
              .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl;
  DescriptorCount._M_elems[0xc] = 0;
  DescriptorCount._M_elems[0xd] = 0;
  DescriptorCount._M_elems[0xe] = 0;
  DescriptorCount._M_elems[0xf] = 0;
  DescriptorCount._M_elems[8] = 0;
  DescriptorCount._M_elems[9] = 0;
  DescriptorCount._M_elems[10] = 0;
  DescriptorCount._M_elems[0xb] = 0;
  DescriptorCount._M_elems[4] = 0;
  DescriptorCount._M_elems[5] = 0;
  DescriptorCount._M_elems[6] = 0;
  DescriptorCount._M_elems[7] = 0;
  DescriptorCount._M_elems[0] = 0;
  DescriptorCount._M_elems[1] = 0;
  DescriptorCount._M_elems[2] = 0;
  DescriptorCount._M_elems[3] = 0;
  memset(&PerStageDescriptorCount,0,0x180);
  ShaderStagePresented._M_elems[4] = false;
  ShaderStagePresented._M_elems[5] = false;
  ShaderStagePresented._M_elems[0] = false;
  ShaderStagePresented._M_elems[1] = false;
  ShaderStagePresented._M_elems[2] = false;
  ShaderStagePresented._M_elems[3] = false;
  if ((this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).m_SignatureCount != '\0') {
    pPVar1 = &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
              .m_Desc;
    uVar12 = 0;
    do {
      this_00 = (this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).m_Signatures[uVar12].
                m_pObject;
      if ((this_00 != (PipelineResourceSignatureVkImpl *)0x0) &&
         ((this_00->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
          .m_Desc.NumResources != 0)) {
        local_238 = &(this_00->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                     super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                     .m_Desc;
        ResIndex = 0;
        do {
          Args_4 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceDesc
                             (&this_00->
                               super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                              ResIndex);
          pPVar10 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceAttribs
                              (&this_00->
                                super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                               ResIndex);
          uVar6 = (uint)((ulong)*(undefined8 *)pPVar10 >> 0x20);
          uVar11 = (ulong)((uVar6 >> 0x19 & 0x1f) << 2);
          piVar2 = (int *)((long)DescriptorCount._M_elems + uVar11);
          *piVar2 = *piVar2 + (uVar6 & 0x1ffffff);
          SVar8 = Args_4->ShaderStages;
          if (SVar8 != SHADER_TYPE_UNKNOWN) {
            do {
              ShaderType = -SVar8 & SVar8;
              IVar7 = GetShaderTypePipelineIndex
                                (ShaderType,
                                 (this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                                 super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                                 .m_Desc.PipelineType);
              piVar2 = (int *)((long)PerStageDescriptorCount._M_elems[IVar7]._M_elems + uVar11);
              *piVar2 = *piVar2 + (*(uint *)&pPVar10->field_0x4 & 0x1ffffff);
              ShaderStagePresented._M_elems[IVar7] = true;
              bVar15 = ShaderType != SVar8;
              SVar8 = ShaderType ^ SVar8;
            } while (bVar15);
          }
          if ((Args_4->Flags & PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY) == PIPELINE_RESOURCE_FLAG_NONE)
          goto LAB_00205b0b;
          if (0xf < ((byte)((ulong)*(undefined8 *)pPVar10 >> 0x39) & 0x1f)) {
switchD_00205924_caseD_e:
            FormatString<char[27]>(&msg,(char (*) [27])"Unexpected descriptor type");
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"DvpValidateResourceLimits",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                       ,0x41e);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
            bVar16 = false;
            bVar15 = false;
            goto LAB_00205a32;
          }
          switch((uint)((ulong)*(undefined8 *)pPVar10 >> 0x39) & 0x1f) {
          case 0:
          case 0xf:
            bVar16 = true;
            bVar15 = true;
            goto LAB_00205a32;
          case 1:
          case 2:
            VVar3 = (local_248->m_ExtFeatures).DescriptorIndexing.
                    shaderSampledImageArrayNonUniformIndexing;
            goto LAB_00205997;
          case 3:
            bVar16 = (local_248->m_ExtFeatures).DescriptorIndexing.
                     shaderStorageImageArrayNonUniformIndexing != 0;
            bVar15 = (local_250->m_ExtProperties).DescriptorIndexing.
                     shaderStorageImageArrayNonUniformIndexingNative == 0;
            break;
          case 4:
            VVar3 = (local_248->m_ExtFeatures).DescriptorIndexing.
                    shaderUniformTexelBufferArrayNonUniformIndexing;
LAB_00205997:
            bVar16 = VVar3 != 0;
            bVar15 = (local_250->m_ExtProperties).DescriptorIndexing.
                     shaderSampledImageArrayNonUniformIndexingNative == 0;
            break;
          case 5:
          case 6:
            VVar3 = (local_248->m_ExtFeatures).DescriptorIndexing.
                    shaderStorageTexelBufferArrayNonUniformIndexing;
            goto LAB_00205957;
          case 7:
          case 8:
            bVar16 = (local_248->m_ExtFeatures).DescriptorIndexing.
                     shaderUniformBufferArrayNonUniformIndexing != 0;
            bVar15 = (local_250->m_ExtProperties).DescriptorIndexing.
                     shaderUniformBufferArrayNonUniformIndexingNative == 0;
            break;
          default:
            VVar3 = (local_248->m_ExtFeatures).DescriptorIndexing.
                    shaderStorageBufferArrayNonUniformIndexing;
LAB_00205957:
            bVar16 = VVar3 != 0;
            bVar15 = (local_250->m_ExtProperties).DescriptorIndexing.
                     shaderStorageBufferArrayNonUniformIndexingNative == 0;
            break;
          case 0xd:
            bVar16 = (local_248->m_ExtFeatures).DescriptorIndexing.
                     shaderInputAttachmentArrayNonUniformIndexing != 0;
            bVar15 = (local_250->m_ExtProperties).DescriptorIndexing.
                     shaderInputAttachmentArrayNonUniformIndexingNative == 0;
            break;
          case 0xe:
            goto switchD_00205924_caseD_e;
          }
          bVar15 = !bVar15;
LAB_00205a32:
          if (bVar16) {
            if (!bVar15) {
              FormatString<char[29],char_const*,char[24],char_const*,char[21],char_const*,char[91]>
                        (&msg,(Diligent *)"Performance warning in PSO \'",(char (*) [29])pPVar1,
                         (char **)"\', resource signature \'",(char (*) [24])local_238,
                         (char **)"\': shader resource \'",(char (*) [21])Args_4,
                         (char **)
                         "\' is defined with RUNTIME_ARRAY flag, but non-uniform indexing is emulated on this device."
                         ,(char (*) [91])msg._M_dataplus._M_p);
              if (DebugMessageCallback != (undefined *)0x0) {
                (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0,0);
              }
              goto LAB_00205af0;
            }
          }
          else {
            FormatString<char[6],char_const*,char[24],char_const*,char[29],char_const*,char[124]>
                      (&msg,(Diligent *)0x6bf26d,(char (*) [6])pPVar1,
                       (char **)"\', resource signature \'",(char (*) [24])local_238,
                       (char **)"\' contains shader resource \'",(char (*) [29])Args_4,
                       (char **)
                       "\' that is defined with RUNTIME_ARRAY flag, but current device does not support non-uniform indexing for this resource type."
                       ,(char (*) [124])msg._M_dataplus._M_p);
            if (DebugMessageCallback != (undefined *)0x0) {
              (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0,0);
            }
LAB_00205af0:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
          }
LAB_00205b0b:
          ResIndex = ResIndex + 1;
        } while (ResIndex <
                 (this_00->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                 super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                 .m_Desc.NumResources);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < (this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).m_SignatureCount
            );
  }
  _NumSampledImages =
       (Char *)CONCAT44(uStack_26c,
                        DescriptorCount._M_elems[2] + DescriptorCount._M_elems[1] +
                        DescriptorCount._M_elems[4]);
  NumStorageImages =
       DescriptorCount._M_elems[5] + DescriptorCount._M_elems[3] + DescriptorCount._M_elems[6];
  NumStorageBuffers = DescriptorCount._M_elems[10] + DescriptorCount._M_elems[9];
  NumDynamicStorageBuffers = DescriptorCount._M_elems[0xc] + DescriptorCount._M_elems[0xb];
  NumSamplers = DescriptorCount._M_elems[0];
  NumUniformBuffers = DescriptorCount._M_elems[7];
  NumDynamicUniformBuffers = DescriptorCount._M_elems[8];
  NumInputAttachments = DescriptorCount._M_elems[0xd];
  NumAccelerationStructures = DescriptorCount._M_elems[0xf];
  if (*(uint32_t *)((long)&(pVVar4->m_Properties).limits + 0x60) < DescriptorCount._M_elems[0]) {
    FormatString<char[9],char_const*,char[28],unsigned_int,char[22],unsigned_int,char[3]>
              (&msg,(Diligent *)"In PSO \'",
               (char (*) [9])
               &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                .m_Desc,(char **)"\', the number of samplers (",(char (*) [28])&NumSamplers,
               (uint *)") exceeds the limit (",
               (char (*) [22])((long)&(pVVar4->m_Properties).limits + 0x60),(uint *)0x773e90,
               (char (*) [3])msg._M_dataplus._M_p);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"DvpValidateResourceLimits",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,0x447);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(uint32_t *)((long)&(pVVar4->m_Properties).limits + 0x74) < NumSampledImages) {
    FormatString<char[9],char_const*,char[34],unsigned_int,char[22],unsigned_int,char[3]>
              (&msg,(Diligent *)"In PSO \'",
               (char (*) [9])
               &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                .m_Desc,(char **)"\', the number of sampled images (",
               (char (*) [34])&NumSampledImages,(uint *)") exceeds the limit (",
               (char (*) [22])((long)&(pVVar4->m_Properties).limits + 0x74),(uint *)0x773e90,
               (char (*) [3])msg._M_dataplus._M_p);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"DvpValidateResourceLimits",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,0x449);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(uint32_t *)((long)&(pVVar4->m_Properties).limits + 0x78) < NumStorageImages) {
    FormatString<char[9],char_const*,char[34],unsigned_int,char[22],unsigned_int,char[3]>
              (&msg,(Diligent *)"In PSO \'",
               (char (*) [9])
               &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                .m_Desc,(char **)"\', the number of storage images (",
               (char (*) [34])&NumStorageImages,(uint *)") exceeds the limit (",
               (char (*) [22])((long)&(pVVar4->m_Properties).limits + 0x78),(uint *)0x773e90,
               (char (*) [3])msg._M_dataplus._M_p);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"DvpValidateResourceLimits",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,1099);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(uint32_t *)((long)&(pVVar4->m_Properties).limits + 0x6c) < NumStorageBuffers) {
    FormatString<char[9],char_const*,char[35],unsigned_int,char[22],unsigned_int,char[3]>
              (&msg,(Diligent *)"In PSO \'",
               (char (*) [9])
               &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                .m_Desc,(char **)"\', the number of storage buffers (",
               (char (*) [35])&NumStorageBuffers,(uint *)") exceeds the limit (",
               (char (*) [22])((long)&(pVVar4->m_Properties).limits + 0x6c),(uint *)0x773e90,
               (char (*) [3])msg._M_dataplus._M_p);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"DvpValidateResourceLimits",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,0x44d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(uint32_t *)((long)&(pVVar4->m_Properties).limits + 0x70) < NumDynamicStorageBuffers) {
    FormatString<char[9],char_const*,char[43],unsigned_int,char[22],unsigned_int,char[3]>
              (&msg,(Diligent *)"In PSO \'",
               (char (*) [9])
               &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                .m_Desc,(char **)"\', the number of dynamic storage buffers (",
               (char (*) [43])&NumDynamicStorageBuffers,(uint *)") exceeds the limit (",
               (char (*) [22])((long)&(pVVar4->m_Properties).limits + 0x70),(uint *)0x773e90,
               (char (*) [3])msg._M_dataplus._M_p);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"DvpValidateResourceLimits",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,0x44f);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(uint32_t *)((long)&(pVVar4->m_Properties).limits + 100) < NumUniformBuffers) {
    FormatString<char[9],char_const*,char[35],unsigned_int,char[22],unsigned_int,char[3]>
              (&msg,(Diligent *)"In PSO \'",
               (char (*) [9])
               &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                .m_Desc,(char **)"\', the number of uniform buffers (",
               (char (*) [35])&NumUniformBuffers,(uint *)") exceeds the limit (",
               (char (*) [22])((long)&(pVVar4->m_Properties).limits + 100),(uint *)0x773e90,
               (char (*) [3])msg._M_dataplus._M_p);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"DvpValidateResourceLimits",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,0x451);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(uint32_t *)((long)&(pVVar4->m_Properties).limits + 0x68) < NumDynamicUniformBuffers) {
    FormatString<char[9],char_const*,char[43],unsigned_int,char[22],unsigned_int,char[3]>
              (&msg,(Diligent *)"In PSO \'",
               (char (*) [9])
               &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                .m_Desc,(char **)"\', the number of dynamic uniform buffers (",
               (char (*) [43])&NumDynamicUniformBuffers,(uint *)") exceeds the limit (",
               (char (*) [22])((long)&(pVVar4->m_Properties).limits + 0x68),(uint *)0x773e90,
               (char (*) [3])msg._M_dataplus._M_p);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"DvpValidateResourceLimits",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,0x453);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(uint32_t *)((long)&(pVVar4->m_Properties).limits + 0x7c) < NumInputAttachments) {
    FormatString<char[9],char_const*,char[37],unsigned_int,char[22],unsigned_int,char[3]>
              (&msg,(Diligent *)"In PSO \'",
               (char (*) [9])
               &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                .m_Desc,(char **)"\', the number of input attachments (",
               (char (*) [37])&NumInputAttachments,(uint *)") exceeds the limit (",
               (char (*) [22])((long)&(pVVar4->m_Properties).limits + 0x7c),(uint *)0x773e90,
               (char (*) [3])msg._M_dataplus._M_p);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"DvpValidateResourceLimits",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,0x455);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(uint32_t *)((long)&(pVVar5->m_ExtProperties).AccelStruct + 0x30) < NumAccelerationStructures
     ) {
    FormatString<char[9],char_const*,char[43],unsigned_int,char[22],unsigned_int,char[3]>
              (&msg,(Diligent *)"In PSO \'",
               (char (*) [9])
               &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                .m_Desc,(char **)"\', the number of acceleration structures (",
               (char (*) [43])&NumAccelerationStructures,(uint *)") exceeds the limit (",
               (char (*) [22])((long)&(pVVar5->m_ExtProperties).AccelStruct + 0x30),(uint *)0x773e90
               ,(char (*) [3])msg._M_dataplus._M_p);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"DvpValidateResourceLimits",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,0x457);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  pPVar1 = &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
            .m_Desc;
  Args_6 = (uint32_t *)((long)&(pVVar4->m_Properties).limits + 0x5c);
  Args_6_00 = (uint32_t *)((long)&(pVVar4->m_Properties).limits + 0x44);
  Args_6_01 = (uint32_t *)((long)&(pVVar4->m_Properties).limits + 0x50);
  local_248 = (VulkanPhysicalDevice *)((long)&(pVVar4->m_Properties).limits + 0x54);
  local_250 = (VulkanPhysicalDevice *)((long)&(pVVar4->m_Properties).limits + 0x4c);
  local_238 = (PipelineResourceSignatureDesc *)((long)&(pVVar4->m_Properties).limits + 0x48);
  Args_6_02 = (uint32_t *)((long)&(pVVar4->m_Properties).limits + 0x58);
  Args_6_03 = (uint32_t *)((long)&(pVVar5->m_ExtProperties).AccelStruct + 0x28);
  lVar13 = 0;
  paVar14 = PerStageDescriptorCount._M_elems;
  do {
    if (ShaderStagePresented._M_elems[lVar13] == true) {
      SVar8 = GetShaderTypeFromPipelineIndex
                        ((Int32)lVar13,
                         (this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                         super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                         .m_Desc.PipelineType);
      _NumSampledImages = GetShaderTypeLiteralName(SVar8);
      NumStorageImages =
           ((array<unsigned_int,_16UL> *)paVar14->_M_elems)->_M_elems[2] +
           ((array<unsigned_int,_16UL> *)paVar14->_M_elems)->_M_elems[1] +
           ((array<unsigned_int,_16UL> *)paVar14->_M_elems)->_M_elems[4];
      NumStorageBuffers =
           ((array<unsigned_int,_16UL> *)paVar14->_M_elems)->_M_elems[5] +
           ((array<unsigned_int,_16UL> *)paVar14->_M_elems)->_M_elems[3] +
           ((array<unsigned_int,_16UL> *)paVar14->_M_elems)->_M_elems[6];
      NumDynamicStorageBuffers =
           ((array<unsigned_int,_16UL> *)paVar14->_M_elems)->_M_elems[10] +
           ((array<unsigned_int,_16UL> *)paVar14->_M_elems)->_M_elems[9] +
           ((array<unsigned_int,_16UL> *)paVar14->_M_elems)->_M_elems[0xb] +
           ((array<unsigned_int,_16UL> *)paVar14->_M_elems)->_M_elems[0xc];
      NumSamplers = ((array<unsigned_int,_16UL> *)paVar14->_M_elems)->_M_elems[8] +
                    ((array<unsigned_int,_16UL> *)paVar14->_M_elems)->_M_elems[7];
      NumUniformBuffers = ((array<unsigned_int,_16UL> *)paVar14->_M_elems)->_M_elems[0];
      NumDynamicUniformBuffers = ((array<unsigned_int,_16UL> *)paVar14->_M_elems)->_M_elems[0xd];
      NumInputAttachments = ((array<unsigned_int,_16UL> *)paVar14->_M_elems)->_M_elems[0xf];
      NumAccelerationStructures =
           NumSamplers + NumUniformBuffers + NumDynamicUniformBuffers + NumInputAttachments +
           NumStorageBuffers + NumStorageImages + NumDynamicStorageBuffers;
      if (*Args_6 < NumAccelerationStructures) {
        FormatString<char[9],char_const*,char[17],char_const*,char[35],unsigned_int,char[32],unsigned_int,char[3]>
                  (&msg,(Diligent *)"In PSO \'",(char (*) [9])pPVar1,(char **)"\' shader stage \'",
                   (char (*) [17])&NumSampledImages,(char **)"\', the total number of resources (",
                   (char (*) [35])&NumAccelerationStructures,
                   (uint *)") exceeds the per-stage limit (",(char (*) [32])Args_6,(uint *)0x773e90,
                   (char (*) [3])msg._M_dataplus._M_p);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"DvpValidateResourceLimits",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                   ,0x47a);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      if (*Args_6_00 < NumUniformBuffers) {
        FormatString<char[9],char_const*,char[17],char_const*,char[28],unsigned_int,char[32],unsigned_int,char[3]>
                  (&msg,(Diligent *)"In PSO \'",(char (*) [9])pPVar1,(char **)"\' shader stage \'",
                   (char (*) [17])&NumSampledImages,(char **)"\', the number of samplers (",
                   (char (*) [28])&NumUniformBuffers,(uint *)") exceeds the per-stage limit (",
                   (char (*) [32])Args_6_00,(uint *)0x773e90,(char (*) [3])msg._M_dataplus._M_p);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"DvpValidateResourceLimits",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                   ,0x47c);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      if (*Args_6_01 < NumStorageImages) {
        FormatString<char[9],char_const*,char[17],char_const*,char[34],unsigned_int,char[32],unsigned_int,char[3]>
                  (&msg,(Diligent *)"In PSO \'",(char (*) [9])pPVar1,(char **)"\' shader stage \'",
                   (char (*) [17])&NumSampledImages,(char **)"\', the number of sampled images (",
                   (char (*) [34])&NumStorageImages,(uint *)") exceeds the per-stage limit (",
                   (char (*) [32])Args_6_01,(uint *)0x773e90,(char (*) [3])msg._M_dataplus._M_p);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"DvpValidateResourceLimits",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                   ,0x47e);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      if (*(uint *)local_248 < NumStorageBuffers) {
        FormatString<char[9],char_const*,char[17],char_const*,char[34],unsigned_int,char[32],unsigned_int,char[3]>
                  (&msg,(Diligent *)"In PSO \'",(char (*) [9])pPVar1,(char **)"\' shader stage \'",
                   (char (*) [17])&NumSampledImages,(char **)"\', the number of storage images (",
                   (char (*) [34])&NumStorageBuffers,(uint *)") exceeds the per-stage limit (",
                   (char (*) [32])local_248,(uint *)0x773e90,(char (*) [3])msg._M_dataplus._M_p);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"DvpValidateResourceLimits",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                   ,0x480);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      if (*(uint *)local_250 < NumDynamicStorageBuffers) {
        FormatString<char[9],char_const*,char[17],char_const*,char[35],unsigned_int,char[32],unsigned_int,char[3]>
                  (&msg,(Diligent *)"In PSO \'",(char (*) [9])pPVar1,(char **)"\' shader stage \'",
                   (char (*) [17])&NumSampledImages,(char **)"\', the number of storage buffers (",
                   (char (*) [35])&NumDynamicStorageBuffers,
                   (uint *)") exceeds the per-stage limit (",(char (*) [32])local_250,
                   (uint *)0x773e90,(char (*) [3])msg._M_dataplus._M_p);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"DvpValidateResourceLimits",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                   ,0x482);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      if (*(uint *)local_238 < NumSamplers) {
        FormatString<char[9],char_const*,char[17],char_const*,char[35],unsigned_int,char[32],unsigned_int,char[3]>
                  (&msg,(Diligent *)"In PSO \'",(char (*) [9])pPVar1,(char **)"\' shader stage \'",
                   (char (*) [17])&NumSampledImages,(char **)"\', the number of uniform buffers (",
                   (char (*) [35])&NumSamplers,(uint *)") exceeds the per-stage limit (",
                   (char (*) [32])local_238,(uint *)0x773e90,(char (*) [3])msg._M_dataplus._M_p);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"DvpValidateResourceLimits",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                   ,0x484);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      if (*Args_6_02 < NumDynamicUniformBuffers) {
        FormatString<char[9],char_const*,char[17],char_const*,char[37],unsigned_int,char[32],unsigned_int,char[3]>
                  (&msg,(Diligent *)"In PSO \'",(char (*) [9])pPVar1,(char **)"\' shader stage \'",
                   (char (*) [17])&NumSampledImages,(char **)"\', the number of input attachments ("
                   ,(char (*) [37])&NumDynamicUniformBuffers,
                   (uint *)") exceeds the per-stage limit (",(char (*) [32])Args_6_02,
                   (uint *)0x773e90,(char (*) [3])msg._M_dataplus._M_p);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"DvpValidateResourceLimits",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                   ,0x486);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      if (*Args_6_03 < NumInputAttachments) {
        FormatString<char[9],char_const*,char[17],char_const*,char[43],unsigned_int,char[32],unsigned_int,char[3]>
                  (&msg,(Diligent *)"In PSO \'",(char (*) [9])pPVar1,(char **)"\' shader stage \'",
                   (char (*) [17])&NumSampledImages,
                   (char **)"\', the number of acceleration structures (",
                   (char (*) [43])&NumInputAttachments,(uint *)") exceeds the per-stage limit (",
                   (char (*) [32])Args_6_03,(uint *)0x773e90,(char (*) [3])msg._M_dataplus._M_p);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"DvpValidateResourceLimits",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                   ,0x488);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
    }
    lVar13 = lVar13 + 1;
    paVar14 = paVar14 + 1;
  } while (lVar13 != 6);
  return;
}

Assistant:

void PipelineStateVkImpl::DvpValidateResourceLimits() const
{
    const VkPhysicalDeviceLimits&                             Limits       = GetDevice()->GetPhysicalDevice().GetProperties().limits;
    const VkPhysicalDeviceAccelerationStructurePropertiesKHR& ASLimits     = GetDevice()->GetPhysicalDevice().GetExtProperties().AccelStruct;
    const VkPhysicalDeviceDescriptorIndexingFeaturesEXT&      DescIndFeats = GetDevice()->GetPhysicalDevice().GetExtFeatures().DescriptorIndexing;
    const VkPhysicalDeviceDescriptorIndexingPropertiesEXT&    DescIndProps = GetDevice()->GetPhysicalDevice().GetExtProperties().DescriptorIndexing;
    const Uint32                                              DescCount    = static_cast<Uint32>(DescriptorType::Count);

    std::array<Uint32, DescCount>                                      DescriptorCount         = {};
    std::array<std::array<Uint32, DescCount>, MAX_SHADERS_IN_PIPELINE> PerStageDescriptorCount = {};
    std::array<bool, MAX_SHADERS_IN_PIPELINE>                          ShaderStagePresented    = {};

    for (Uint32 s = 0; s < m_SignatureCount; ++s)
    {
        const PipelineResourceSignatureVkImpl* pSignature = m_Signatures[s];
        if (pSignature == nullptr)
            continue;

        for (Uint32 r = 0; r < pSignature->GetTotalResourceCount(); ++r)
        {
            const PipelineResourceDesc&                             ResDesc   = pSignature->GetResourceDesc(r);
            const PipelineResourceSignatureVkImpl::ResourceAttribs& ResAttr   = pSignature->GetResourceAttribs(r);
            const Uint32                                            DescIndex = static_cast<Uint32>(ResAttr.DescrType);

            DescriptorCount[DescIndex] += ResAttr.ArraySize;

            for (SHADER_TYPE ShaderStages = ResDesc.ShaderStages; ShaderStages != 0;)
            {
                const Int32 ShaderInd = GetShaderTypePipelineIndex(ExtractLSB(ShaderStages), m_Desc.PipelineType);
                PerStageDescriptorCount[ShaderInd][DescIndex] += ResAttr.ArraySize;
                ShaderStagePresented[ShaderInd] = true;
            }

            if ((ResDesc.Flags & PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY) != 0)
            {
                bool NonUniformIndexingSupported = false;
                bool NonUniformIndexingIsNative  = false;
                switch (ResAttr.GetDescriptorType())
                {
                    case DescriptorType::Sampler:
                        NonUniformIndexingSupported = true;
                        NonUniformIndexingIsNative  = true;
                        break;
                    case DescriptorType::CombinedImageSampler:
                    case DescriptorType::SeparateImage:
                        NonUniformIndexingSupported = DescIndFeats.shaderSampledImageArrayNonUniformIndexing;
                        NonUniformIndexingIsNative  = DescIndProps.shaderSampledImageArrayNonUniformIndexingNative;
                        break;
                    case DescriptorType::StorageImage:
                        NonUniformIndexingSupported = DescIndFeats.shaderStorageImageArrayNonUniformIndexing;
                        NonUniformIndexingIsNative  = DescIndProps.shaderStorageImageArrayNonUniformIndexingNative;
                        break;
                    case DescriptorType::UniformTexelBuffer:
                        NonUniformIndexingSupported = DescIndFeats.shaderUniformTexelBufferArrayNonUniformIndexing;
                        NonUniformIndexingIsNative  = DescIndProps.shaderSampledImageArrayNonUniformIndexingNative;
                        break;
                    case DescriptorType::StorageTexelBuffer:
                    case DescriptorType::StorageTexelBuffer_ReadOnly:
                        NonUniformIndexingSupported = DescIndFeats.shaderStorageTexelBufferArrayNonUniformIndexing;
                        NonUniformIndexingIsNative  = DescIndProps.shaderStorageBufferArrayNonUniformIndexingNative;
                        break;
                    case DescriptorType::UniformBuffer:
                    case DescriptorType::UniformBufferDynamic:
                        NonUniformIndexingSupported = DescIndFeats.shaderUniformBufferArrayNonUniformIndexing;
                        NonUniformIndexingIsNative  = DescIndProps.shaderUniformBufferArrayNonUniformIndexingNative;
                        break;
                    case DescriptorType::StorageBuffer:
                    case DescriptorType::StorageBuffer_ReadOnly:
                    case DescriptorType::StorageBufferDynamic:
                    case DescriptorType::StorageBufferDynamic_ReadOnly:
                        NonUniformIndexingSupported = DescIndFeats.shaderStorageBufferArrayNonUniformIndexing;
                        NonUniformIndexingIsNative  = DescIndProps.shaderStorageBufferArrayNonUniformIndexingNative;
                        break;
                    case DescriptorType::InputAttachment:
                        NonUniformIndexingSupported = DescIndFeats.shaderInputAttachmentArrayNonUniformIndexing;
                        NonUniformIndexingIsNative  = DescIndProps.shaderInputAttachmentArrayNonUniformIndexingNative;
                        break;
                    case DescriptorType::AccelerationStructure:
                        // There is no separate feature for acceleration structures, GLSL spec says:
                        // "If GL_EXT_nonuniform_qualifier is supported
                        // When aggregated into arrays within a shader, accelerationStructureEXT can
                        // be indexed with a non-uniform integral expressions, when decorated with the
                        // nonuniformEXT qualifier."
                        // Descriptor indexing is supported here, otherwise error will be generated in ValidatePipelineResourceSignatureDesc().
                        NonUniformIndexingSupported = true;
                        NonUniformIndexingIsNative  = true;
                        break;

                    default:
                        UNEXPECTED("Unexpected descriptor type");
                }

                // TODO: We don't know if this resource is used for non-uniform indexing or not.
                if (!NonUniformIndexingSupported)
                {
                    LOG_WARNING_MESSAGE("PSO '", m_Desc.Name, "', resource signature '", pSignature->GetDesc().Name, "' contains shader resource '",
                                        ResDesc.Name, "' that is defined with RUNTIME_ARRAY flag, but current device does not support non-uniform indexing for this resource type.");
                }
                else if (!NonUniformIndexingIsNative)
                {
                    LOG_WARNING_MESSAGE("Performance warning in PSO '", m_Desc.Name, "', resource signature '", pSignature->GetDesc().Name, "': shader resource '",
                                        ResDesc.Name, "' is defined with RUNTIME_ARRAY flag, but non-uniform indexing is emulated on this device.");
                }
            }
        }
    }

    // Check total descriptor count
    {
        const Uint32 NumSampledImages =
            DescriptorCount[static_cast<Uint32>(DescriptorType::CombinedImageSampler)] +
            DescriptorCount[static_cast<Uint32>(DescriptorType::SeparateImage)] +
            DescriptorCount[static_cast<Uint32>(DescriptorType::UniformTexelBuffer)];
        const Uint32 NumStorageImages =
            DescriptorCount[static_cast<Uint32>(DescriptorType::StorageImage)] +
            DescriptorCount[static_cast<Uint32>(DescriptorType::StorageTexelBuffer)] +
            DescriptorCount[static_cast<Uint32>(DescriptorType::StorageTexelBuffer_ReadOnly)];
        const Uint32 NumStorageBuffers =
            DescriptorCount[static_cast<Uint32>(DescriptorType::StorageBuffer)] +
            DescriptorCount[static_cast<Uint32>(DescriptorType::StorageBuffer_ReadOnly)];
        const Uint32 NumDynamicStorageBuffers =
            DescriptorCount[static_cast<Uint32>(DescriptorType::StorageBufferDynamic)] +
            DescriptorCount[static_cast<Uint32>(DescriptorType::StorageBufferDynamic_ReadOnly)];
        const Uint32 NumSamplers               = DescriptorCount[static_cast<Uint32>(DescriptorType::Sampler)];
        const Uint32 NumUniformBuffers         = DescriptorCount[static_cast<Uint32>(DescriptorType::UniformBuffer)];
        const Uint32 NumDynamicUniformBuffers  = DescriptorCount[static_cast<Uint32>(DescriptorType::UniformBufferDynamic)];
        const Uint32 NumInputAttachments       = DescriptorCount[static_cast<Uint32>(DescriptorType::InputAttachment)];
        const Uint32 NumAccelerationStructures = DescriptorCount[static_cast<Uint32>(DescriptorType::AccelerationStructure)];

        DEV_CHECK_ERR(NumSamplers <= Limits.maxDescriptorSetSamplers,
                      "In PSO '", m_Desc.Name, "', the number of samplers (", NumSamplers, ") exceeds the limit (", Limits.maxDescriptorSetSamplers, ").");
        DEV_CHECK_ERR(NumSampledImages <= Limits.maxDescriptorSetSampledImages,
                      "In PSO '", m_Desc.Name, "', the number of sampled images (", NumSampledImages, ") exceeds the limit (", Limits.maxDescriptorSetSampledImages, ").");
        DEV_CHECK_ERR(NumStorageImages <= Limits.maxDescriptorSetStorageImages,
                      "In PSO '", m_Desc.Name, "', the number of storage images (", NumStorageImages, ") exceeds the limit (", Limits.maxDescriptorSetStorageImages, ").");
        DEV_CHECK_ERR(NumStorageBuffers <= Limits.maxDescriptorSetStorageBuffers,
                      "In PSO '", m_Desc.Name, "', the number of storage buffers (", NumStorageBuffers, ") exceeds the limit (", Limits.maxDescriptorSetStorageBuffers, ").");
        DEV_CHECK_ERR(NumDynamicStorageBuffers <= Limits.maxDescriptorSetStorageBuffersDynamic,
                      "In PSO '", m_Desc.Name, "', the number of dynamic storage buffers (", NumDynamicStorageBuffers, ") exceeds the limit (", Limits.maxDescriptorSetStorageBuffersDynamic, ").");
        DEV_CHECK_ERR(NumUniformBuffers <= Limits.maxDescriptorSetUniformBuffers,
                      "In PSO '", m_Desc.Name, "', the number of uniform buffers (", NumUniformBuffers, ") exceeds the limit (", Limits.maxDescriptorSetUniformBuffers, ").");
        DEV_CHECK_ERR(NumDynamicUniformBuffers <= Limits.maxDescriptorSetUniformBuffersDynamic,
                      "In PSO '", m_Desc.Name, "', the number of dynamic uniform buffers (", NumDynamicUniformBuffers, ") exceeds the limit (", Limits.maxDescriptorSetUniformBuffersDynamic, ").");
        DEV_CHECK_ERR(NumInputAttachments <= Limits.maxDescriptorSetInputAttachments,
                      "In PSO '", m_Desc.Name, "', the number of input attachments (", NumInputAttachments, ") exceeds the limit (", Limits.maxDescriptorSetInputAttachments, ").");
        DEV_CHECK_ERR(NumAccelerationStructures <= ASLimits.maxDescriptorSetAccelerationStructures,
                      "In PSO '", m_Desc.Name, "', the number of acceleration structures (", NumAccelerationStructures, ") exceeds the limit (", ASLimits.maxDescriptorSetAccelerationStructures, ").");
    }

    // Check per stage descriptor count
    for (Uint32 ShaderInd = 0; ShaderInd < PerStageDescriptorCount.size(); ++ShaderInd)
    {
        if (!ShaderStagePresented[ShaderInd])
            continue;

        const std::array<Uint32, DescCount>& NumDesc    = PerStageDescriptorCount[ShaderInd];
        const SHADER_TYPE                    ShaderType = GetShaderTypeFromPipelineIndex(ShaderInd, m_Desc.PipelineType);
        const char*                          StageName  = GetShaderTypeLiteralName(ShaderType);

        const Uint32 NumSampledImages =
            NumDesc[static_cast<Uint32>(DescriptorType::CombinedImageSampler)] +
            NumDesc[static_cast<Uint32>(DescriptorType::SeparateImage)] +
            NumDesc[static_cast<Uint32>(DescriptorType::UniformTexelBuffer)];
        const Uint32 NumStorageImages =
            NumDesc[static_cast<Uint32>(DescriptorType::StorageImage)] +
            NumDesc[static_cast<Uint32>(DescriptorType::StorageTexelBuffer)] +
            NumDesc[static_cast<Uint32>(DescriptorType::StorageTexelBuffer_ReadOnly)];
        const Uint32 NumStorageBuffers =
            NumDesc[static_cast<Uint32>(DescriptorType::StorageBuffer)] +
            NumDesc[static_cast<Uint32>(DescriptorType::StorageBuffer_ReadOnly)] +
            NumDesc[static_cast<Uint32>(DescriptorType::StorageBufferDynamic)] +
            NumDesc[static_cast<Uint32>(DescriptorType::StorageBufferDynamic_ReadOnly)];
        const Uint32 NumUniformBuffers =
            NumDesc[static_cast<Uint32>(DescriptorType::UniformBuffer)] +
            NumDesc[static_cast<Uint32>(DescriptorType::UniformBufferDynamic)];
        const Uint32 NumSamplers               = NumDesc[static_cast<Uint32>(DescriptorType::Sampler)];
        const Uint32 NumInputAttachments       = NumDesc[static_cast<Uint32>(DescriptorType::InputAttachment)];
        const Uint32 NumAccelerationStructures = NumDesc[static_cast<Uint32>(DescriptorType::AccelerationStructure)];
        const Uint32 NumResources              = NumSampledImages + NumStorageImages + NumStorageBuffers + NumUniformBuffers + NumSamplers + NumInputAttachments + NumAccelerationStructures;

        DEV_CHECK_ERR(NumResources <= Limits.maxPerStageResources,
                      "In PSO '", m_Desc.Name, "' shader stage '", StageName, "', the total number of resources (", NumResources, ") exceeds the per-stage limit (", Limits.maxPerStageResources, ").");
        DEV_CHECK_ERR(NumSamplers <= Limits.maxPerStageDescriptorSamplers,
                      "In PSO '", m_Desc.Name, "' shader stage '", StageName, "', the number of samplers (", NumSamplers, ") exceeds the per-stage limit (", Limits.maxPerStageDescriptorSamplers, ").");
        DEV_CHECK_ERR(NumSampledImages <= Limits.maxPerStageDescriptorSampledImages,
                      "In PSO '", m_Desc.Name, "' shader stage '", StageName, "', the number of sampled images (", NumSampledImages, ") exceeds the per-stage limit (", Limits.maxPerStageDescriptorSampledImages, ").");
        DEV_CHECK_ERR(NumStorageImages <= Limits.maxPerStageDescriptorStorageImages,
                      "In PSO '", m_Desc.Name, "' shader stage '", StageName, "', the number of storage images (", NumStorageImages, ") exceeds the per-stage limit (", Limits.maxPerStageDescriptorStorageImages, ").");
        DEV_CHECK_ERR(NumStorageBuffers <= Limits.maxPerStageDescriptorStorageBuffers,
                      "In PSO '", m_Desc.Name, "' shader stage '", StageName, "', the number of storage buffers (", NumStorageBuffers, ") exceeds the per-stage limit (", Limits.maxPerStageDescriptorStorageBuffers, ").");
        DEV_CHECK_ERR(NumUniformBuffers <= Limits.maxPerStageDescriptorUniformBuffers,
                      "In PSO '", m_Desc.Name, "' shader stage '", StageName, "', the number of uniform buffers (", NumUniformBuffers, ") exceeds the per-stage limit (", Limits.maxPerStageDescriptorUniformBuffers, ").");
        DEV_CHECK_ERR(NumInputAttachments <= Limits.maxPerStageDescriptorInputAttachments,
                      "In PSO '", m_Desc.Name, "' shader stage '", StageName, "', the number of input attachments (", NumInputAttachments, ") exceeds the per-stage limit (", Limits.maxPerStageDescriptorInputAttachments, ").");
        DEV_CHECK_ERR(NumAccelerationStructures <= ASLimits.maxPerStageDescriptorAccelerationStructures,
                      "In PSO '", m_Desc.Name, "' shader stage '", StageName, "', the number of acceleration structures (", NumAccelerationStructures, ") exceeds the per-stage limit (", ASLimits.maxPerStageDescriptorAccelerationStructures, ").");
    }
}